

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,Molecule *mol,SelectionSet *bs,int property,int comparator,
          float comparisonValue)

{
  bool bVar1;
  RealType RVar2;
  SnapshotManager *pSVar3;
  double *pdVar4;
  reference bitIndex;
  int in_ECX;
  OpenMDBitSet *this_00;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDX;
  Molecule *in_RSI;
  long in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  bool match;
  Atom *atom;
  AtomIterator ai;
  Vector3d pos;
  RealType propertyValue;
  Vector3<double> *in_stack_fffffffffffffed8;
  Vector3<double> *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  SelectionEvaluator *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff1c;
  SelectionEvaluator *in_stack_ffffffffffffff20;
  Molecule *in_stack_ffffffffffffff38;
  Vector3d *in_stack_ffffffffffffff58;
  Snapshot *in_stack_ffffffffffffff60;
  Vector3<double> local_88;
  Vector3<double> local_70;
  Atom *local_58;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_50;
  Vector3<double> local_48;
  double local_30;
  float local_24;
  int local_20;
  int local_1c;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *local_18;
  Molecule *local_10;
  
  local_30 = 0.0;
  local_24 = in_XMM0_Da;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Vector3<double>::Vector3((Vector3<double> *)0x342efd);
  switch((Molecule *)(ulong)(local_1c - 0x1c00)) {
  case (Molecule *)0x0:
    local_30 = Molecule::getMass((Molecule *)(ulong)(local_1c - 0x1c00));
    break;
  case (Molecule *)0x1:
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_50);
    local_58 = Molecule::beginAtom((Molecule *)in_stack_ffffffffffffff00,
                                   (iterator *)
                                   CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    while (local_58 != (Atom *)0x0) {
      RVar2 = getCharge(in_stack_ffffffffffffff00,
                        (Atom *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      local_30 = RVar2 + local_30;
      local_58 = Molecule::nextAtom((Molecule *)in_stack_ffffffffffffff00,
                                    (iterator *)
                                    CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    }
    break;
  case (Molecule *)0x2:
    Molecule::getCom(in_stack_ffffffffffffff38);
    pdVar4 = Vector3<double>::x(&local_70);
    local_30 = *pdVar4;
    break;
  case (Molecule *)0x3:
    Molecule::getCom(in_stack_ffffffffffffff38);
    pdVar4 = Vector3<double>::y(&local_88);
    local_30 = *pdVar4;
    break;
  case (Molecule *)0x4:
    Molecule::getCom(in_stack_ffffffffffffff38);
    pdVar4 = Vector3<double>::z((Vector3<double> *)&stack0xffffffffffffff60);
    local_30 = *pdVar4;
    break;
  case (Molecule *)0x5:
    Molecule::getCom(in_stack_ffffffffffffff38);
    local_30 = Vector<double,_3U>::length((Vector<double,_3U> *)0x3431bf);
    break;
  case (Molecule *)0x6:
    Molecule::getCom(in_stack_ffffffffffffff38);
    Vector3<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pSVar3 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x208));
    SnapshotManager::getCurrentSnapshot(pSVar3);
    Snapshot::wrapVector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    pdVar4 = Vector3<double>::x(&local_48);
    local_30 = *pdVar4;
    break;
  case (Molecule *)0x7:
    Molecule::getCom(in_stack_ffffffffffffff38);
    Vector3<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pSVar3 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x208));
    SnapshotManager::getCurrentSnapshot(pSVar3);
    Snapshot::wrapVector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    pdVar4 = Vector3<double>::y(&local_48);
    local_30 = *pdVar4;
    break;
  case (Molecule *)0x8:
    Molecule::getCom(in_stack_ffffffffffffff38);
    Vector3<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pSVar3 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x208));
    SnapshotManager::getCurrentSnapshot(pSVar3);
    Snapshot::wrapVector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    pdVar4 = Vector3<double>::z(&local_48);
    local_30 = *pdVar4;
    break;
  default:
    unrecognizedMoleculeProperty(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  bVar1 = false;
  this_00 = (OpenMDBitSet *)(ulong)(local_20 - 0x3400);
  switch(this_00) {
  case (OpenMDBitSet *)0x0:
    bVar1 = (double)local_24 < local_30;
    break;
  case (OpenMDBitSet *)0x1:
    bVar1 = (double)local_24 <= local_30;
    break;
  case (OpenMDBitSet *)0x2:
    bVar1 = local_30 <= (double)local_24;
    break;
  case (OpenMDBitSet *)0x3:
    bVar1 = local_30 < (double)local_24;
    break;
  case (OpenMDBitSet *)0x4:
    bVar1 = ABS(local_30 - (double)local_24) <= 1e-06;
    break;
  case (OpenMDBitSet *)0x5:
    bVar1 = local_30 != (double)local_24;
  }
  if (bVar1) {
    bitIndex = std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                         (local_18,5);
    Molecule::getGlobalIndex(local_10);
    OpenMDBitSet::setBitOn(this_00,(size_t)bitIndex);
  }
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(Molecule* mol, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue) {
    RealType propertyValue = 0.0;
    Vector3d pos;

    switch (property) {
    case Token::mass:
      propertyValue = mol->getMass();
      break;
    case Token::charge: {
      Molecule::AtomIterator ai;
      Atom* atom;
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        propertyValue += getCharge(atom);
      }
    } break;
    case Token::x:
      propertyValue = mol->getCom().x();
      break;
    case Token::y:
      propertyValue = mol->getCom().y();
      break;
    case Token::z:
      propertyValue = mol->getCom().z();
      break;
    case Token::wrappedX:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.z();
      break;
    case Token::r:
      propertyValue = mol->getCom().length();
      break;
    default:
      unrecognizedMoleculeProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }

    if (match) bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
  }